

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

int list_print(AD *list,char *block_type,int index_base)

{
  Integer IVar1;
  ulong uVar2;
  int iVar3;
  
  if (list == (AD *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      IVar1 = ma_table_lookup_assoc((TableData)list);
      printf("%s block \'%s\', handle ",block_type,list->name);
      if (IVar1 == -1) {
        printf("unknown");
      }
      else {
        printf("%ld",IVar1);
      }
      printf(", address 0x%lx",list);
      puts(":");
      printf("\ttype of elements:\t\t%s\n",
             ma_datatype_rel + *(int *)(ma_datatype_rel + list->datatype * 4));
      printf("\tnumber of elements:\t\t%ld\n",list->nelem);
      printf("\taddress of client space:\t0x%lx\n",list->client_space);
      uVar2 = (long)list->client_space - (long)ma_base[list->datatype];
      printf("\tindex for client space:\t\t%ld\n",
             uVar2 / (ulong)(long)ma_sizeof[list->datatype] + (long)index_base,
             uVar2 % (ulong)(long)ma_sizeof[list->datatype]);
      printf("\ttotal number of bytes:\t\t%lu\n",list->nbytes);
      list = list->next;
      iVar3 = iVar3 + 1;
    } while (list != (_AD *)0x0);
  }
  return iVar3;
}

Assistant:

private int list_print(list, block_type, index_base)
    AD        *list;        /* to print */
    char    *block_type;    /* for output */
    int        index_base;    /* 0 (C) or 1 (FORTRAN) */
{
    AD        *ad;        /* traversal pointer */
    int        nblocks;    /* # of blocks on list */

    /* print each block on list */
    for (ad = list, nblocks = 0; ad; ad = ad->next, nblocks++)
    {
        /* print to stdout */
        ad_print(ad, block_type);
        (void)printf(":\n");
        (void)printf("\ttype of elements:\t\t%s\n",
            ma_datatype[ad->datatype]);
        (void)printf("\tnumber of elements:\t\t%ld\n",
            (size_t)ad->nelem);
        (void)printf("\taddress of client space:\t0x%lx\n",
            (size_t)ad->client_space);
        (void)printf("\tindex for client space:\t\t%ld\n",
            (size_t)(client_space_index(ad) + index_base));
        (void)printf("\ttotal number of bytes:\t\t%lu\n",
            ad->nbytes);
    }

    /* return the number of blocks on list */
    return nblocks;
}